

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O0

bool __thiscall
Rml::DataModel::BindFunc(DataModel *this,String *name,DataGetFunc *get_func,DataSetFunc *set_func)

{
  undefined8 uVar1;
  pointer ppVar2;
  pointer definition;
  DataVariable local_80;
  undefined1 local_70 [16];
  unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_> *func_definition_ptr;
  Iter<false> *pIStack_58;
  bool inserted;
  Iter<false> *it;
  undefined1 local_48 [8];
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  result;
  DataSetFunc *set_func_local;
  DataGetFunc *get_func_local;
  String *name_local;
  DataModel *this_local;
  
  it = (Iter<false> *)0x0;
  result._16_8_ = set_func;
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FuncDefinition,std::default_delete<Rml::FuncDefinition>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::emplace<std::__cxx11::string_const&,decltype(nullptr)>
            ((pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
              *)local_48,
             (Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FuncDefinition,std::default_delete<Rml::FuncDefinition>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)&this->function_variable_definitions,name,&it);
  pIStack_58 = (Iter<false> *)local_48;
  func_definition_ptr._7_1_ = (byte)result.first.mInfo & 1;
  if (func_definition_ptr._7_1_ == 0) {
    uVar1 = ::std::__cxx11::string::c_str();
    Log::Message(LT_ERROR,"Data get/set function with name %s already exists in model",uVar1);
    this_local._7_1_ = false;
  }
  else {
    ppVar2 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Iter<false>::operator->(pIStack_58);
    local_70._8_8_ = &ppVar2->second;
    MakeUnique<Rml::FuncDefinition,std::function<void(Rml::Variant&)>,std::function<void(Rml::Variant_const&)>>
              ((function<void_(Rml::Variant_&)> *)local_70,
               (function<void_(const_Rml::Variant_&)> *)get_func);
    ::std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>::operator=
              ((unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_> *)
               local_70._8_8_,
               (unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_> *)
               local_70);
    ::std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>::~unique_ptr
              ((unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_> *)
               local_70);
    definition = ::std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>::
                 get((unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_> *)
                     local_70._8_8_);
    DataVariable::DataVariable(&local_80,&definition->super_VariableDefinition,(void *)0x0);
    this_local._7_1_ = BindVariable(this,name,local_80);
  }
  return this_local._7_1_;
}

Assistant:

bool DataModel::BindFunc(const String& name, DataGetFunc get_func, DataSetFunc set_func)
{
	auto result = function_variable_definitions.emplace(name, nullptr);
	auto& it = result.first;
	bool inserted = result.second;
	if (!inserted)
	{
		Log::Message(Log::LT_ERROR, "Data get/set function with name %s already exists in model", name.c_str());
		return false;
	}
	auto& func_definition_ptr = it->second;
	func_definition_ptr = MakeUnique<FuncDefinition>(std::move(get_func), std::move(set_func));

	return BindVariable(name, DataVariable(func_definition_ptr.get(), nullptr));
}